

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

void __thiscall spvtools::opt::LoopPeeling::GetIteratingExitValues(LoopPeeling *this)

{
  BasicBlock *pBVar1;
  uint32_t uVar2;
  CFG *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  DefUseManager *pDVar4;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var5;
  DominatorAnalysis *pDVar6;
  BasicBlock *pBVar7;
  bool bVar8;
  uint32_t condition_block_id;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = IRContext::cfg(this->context_);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:256:7)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:256:7)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  BasicBlock::ForEachPhiInst
            (this->loop_->loop_header_,(function<void_(spvtools::opt::Instruction_*)> *)&local_50,
             false);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  pBVar1 = this->loop_->loop_merge_;
  if (pBVar1 != (BasicBlock *)0x0) {
    uVar2 = BasicBlock::id(pBVar1);
    pvVar3 = CFG::preds(this_00,uVar2);
    if ((long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start == 4) {
      pDVar4 = IRContext::get_def_use_mgr(this->context_);
      uVar2 = BasicBlock::id(this->loop_->loop_merge_);
      pvVar3 = CFG::preds(this_00,uVar2);
      condition_block_id =
           *(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
      uVar2 = BasicBlock::id(this->loop_->loop_header_);
      pvVar3 = CFG::preds(this_00,uVar2);
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                        ((pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start,
                         (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish,&condition_block_id);
      uVar2 = condition_block_id;
      bVar8 = _Var5._M_current ==
              (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish;
      this->do_while_form_ = !bVar8;
      if (bVar8) {
        pDVar6 = IRContext::GetDominatorAnalysis(this->context_,(this->loop_utils_).function_);
        pBVar7 = CFG::block(this_00,condition_block_id);
        pBVar1 = this->loop_->loop_header_;
        local_50._8_8_ = 0;
        local_50._M_unused._M_object = operator_new(0x18);
        *(DominatorAnalysis **)local_50._M_unused._0_8_ = pDVar6;
        *(BasicBlock **)((long)local_50._M_unused._0_8_ + 8) = pBVar7;
        *(LoopPeeling **)((long)local_50._M_unused._0_8_ + 0x10) = this;
        local_38 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:290:9)>
                   ::_M_invoke;
        local_40 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:290:9)>
                   ::_M_manager;
        BasicBlock::ForEachPhiInst
                  (pBVar1,(function<void_(spvtools::opt::Instruction_*)> *)&local_50,false);
      }
      else {
        pBVar1 = this->loop_->loop_header_;
        local_50._8_8_ = 0;
        local_50._M_unused._M_object = operator_new(0x18);
        *(uint32_t *)local_50._M_unused._0_8_ = uVar2;
        *(DefUseManager **)((long)local_50._M_unused._0_8_ + 8) = pDVar4;
        *(LoopPeeling **)((long)local_50._M_unused._0_8_ + 0x10) = this;
        local_38 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:273:9)>
                   ::_M_invoke;
        local_40 = std::
                   _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp:273:9)>
                   ::_M_manager;
        BasicBlock::ForEachPhiInst
                  (pBVar1,(function<void_(spvtools::opt::Instruction_*)> *)&local_50,false);
      }
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
    }
  }
  return;
}

Assistant:

void LoopPeeling::GetIteratingExitValues() {
  CFG& cfg = *context_->cfg();

  loop_->GetHeaderBlock()->ForEachPhiInst(
      [this](Instruction* phi) { exit_value_[phi->result_id()] = nullptr; });

  if (!loop_->GetMergeBlock()) {
    return;
  }
  if (cfg.preds(loop_->GetMergeBlock()->id()).size() != 1) {
    return;
  }
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  uint32_t condition_block_id = cfg.preds(loop_->GetMergeBlock()->id())[0];

  auto& header_pred = cfg.preds(loop_->GetHeaderBlock()->id());
  do_while_form_ = std::find(header_pred.begin(), header_pred.end(),
                             condition_block_id) != header_pred.end();
  if (do_while_form_) {
    loop_->GetHeaderBlock()->ForEachPhiInst(
        [condition_block_id, def_use_mgr, this](Instruction* phi) {
          std::unordered_set<Instruction*> operations;

          for (uint32_t i = 0; i < phi->NumInOperands(); i += 2) {
            if (condition_block_id == phi->GetSingleWordInOperand(i + 1)) {
              exit_value_[phi->result_id()] =
                  def_use_mgr->GetDef(phi->GetSingleWordInOperand(i));
            }
          }
        });
  } else {
    DominatorTree* dom_tree =
        &context_->GetDominatorAnalysis(loop_utils_.GetFunction())
             ->GetDomTree();
    BasicBlock* condition_block = cfg.block(condition_block_id);

    loop_->GetHeaderBlock()->ForEachPhiInst(
        [dom_tree, condition_block, this](Instruction* phi) {
          std::unordered_set<Instruction*> operations;

          // Not the back-edge value, check if the phi instruction is the only
          // possible candidate.
          GetIteratorUpdateOperations(loop_, phi, &operations);

          for (Instruction* insn : operations) {
            if (insn == phi) {
              continue;
            }
            if (dom_tree->Dominates(context_->get_instr_block(insn),
                                    condition_block)) {
              return;
            }
          }
          exit_value_[phi->result_id()] = phi;
        });
  }
}